

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O0

void __thiscall rsg::ExecutionContext::~ExecutionContext(ExecutionContext *this)

{
  ValueStorage<64> *this_00;
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Self local_18;
  iterator i;
  ExecutionContext *this_local;
  
  i._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<const_rsg::Variable_*,_rsg::ValueStorage<64>_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
       ::begin(&this->m_varValues);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<const_rsg::Variable_*,_rsg::ValueStorage<64>_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
         ::end(&this->m_varValues);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>
             ::operator->(&local_18);
    this_00 = ppVar2->second;
    if (this_00 != (ValueStorage<64> *)0x0) {
      ValueStorage<64>::~ValueStorage(this_00);
      operator_delete(this_00,0x18);
    }
    std::_Rb_tree_iterator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>::
    operator++(&local_18,0);
  }
  std::
  map<const_rsg::Variable_*,_rsg::ValueStorage<64>_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
  ::clear(&this->m_varValues);
  std::vector<rsg::ExecMaskStorage,_std::allocator<rsg::ExecMaskStorage>_>::~vector
            (&this->m_execMaskStack);
  std::
  map<const_rsg::Variable_*,_rsg::ValueStorage<64>_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
  ::~map(&this->m_varValues);
  return;
}

Assistant:

ExecutionContext::~ExecutionContext (void)
{
	for (VarValueMap::iterator i = m_varValues.begin(); i != m_varValues.end(); i++)
		delete i->second;
	m_varValues.clear();
}